

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O0

ENDPOINT_HANDLE connection_create_endpoint(CONNECTION_HANDLE connection)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  LOGGER_LOG p_Var3;
  ENDPOINT_INSTANCE **ppEVar4;
  size_t local_98;
  long local_90;
  ulong local_88;
  size_t local_80;
  long local_78;
  size_t local_70;
  size_t local_68;
  ulong local_60;
  LOGGER_LOG l_3;
  size_t memmove_size;
  LOGGER_LOG l_2;
  size_t realloc_size;
  ENDPOINT_HANDLE *new_endpoints;
  LOGGER_LOG l_1;
  uint32_t i;
  LOGGER_LOG l;
  ENDPOINT_HANDLE result;
  CONNECTION_HANDLE connection_local;
  
  if (connection == (CONNECTION_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                ,"connection_create_endpoint",0x743,1,"NULL connection");
    }
    l = (LOGGER_LOG)0x0;
  }
  else if (connection->endpoint_count < (uint)connection->channel_max) {
    for (l_1._4_4_ = 0;
        (l_1._4_4_ < connection->endpoint_count &&
        (connection->endpoints[l_1._4_4_]->outgoing_channel <= l_1._4_4_));
        l_1._4_4_ = l_1._4_4_ + 1) {
    }
    l = (LOGGER_LOG)calloc(1,0x28);
    if ((ENDPOINT_INSTANCE *)l == (ENDPOINT_INSTANCE *)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                  ,"connection_create_endpoint",0x760,1,"Cannot allocate memory for endpoint");
      }
    }
    else {
      ((ENDPOINT_INSTANCE *)l)->on_endpoint_frame_received = (ON_ENDPOINT_FRAME_RECEIVED)0x0;
      ((ENDPOINT_INSTANCE *)l)->on_connection_state_changed = (ON_CONNECTION_STATE_CHANGED)0x0;
      ((ENDPOINT_INSTANCE *)l)->callback_context = (void *)0x0;
      ((ENDPOINT_INSTANCE *)l)->outgoing_channel = (uint16_t)l_1._4_4_;
      ((ENDPOINT_INSTANCE *)l)->connection = connection;
      if ((ulong)connection->endpoint_count < 0xfffffffffffffffe) {
        local_60 = (ulong)connection->endpoint_count + 1;
      }
      else {
        local_60 = 0xffffffffffffffff;
      }
      if (local_60 == 0) {
        local_68 = 0;
      }
      else {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_60;
        if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) < 8) {
          local_70 = 0xffffffffffffffff;
        }
        else {
          local_70 = local_60 << 3;
        }
        local_68 = local_70;
      }
      if ((local_68 == 0xffffffffffffffff) ||
         (ppEVar4 = (ENDPOINT_INSTANCE **)realloc(connection->endpoints,local_68),
         ppEVar4 == (ENDPOINT_INSTANCE **)0x0)) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                    ,"connection_create_endpoint",0x773,1,
                    "Cannot reallocate memory for connection endpoints, size:%zu",local_68);
        }
        free(l);
        l = (LOGGER_LOG)0x0;
      }
      else {
        connection->endpoints = ppEVar4;
        if (l_1._4_4_ < connection->endpoint_count) {
          if (connection->endpoint_count < l_1._4_4_) {
            local_78 = -1;
          }
          else {
            local_78 = (ulong)connection->endpoint_count - (ulong)l_1._4_4_;
          }
          if (local_78 == 0) {
            local_80 = 0;
          }
          else {
            if (connection->endpoint_count < l_1._4_4_) {
              local_88 = 0xffffffffffffffff;
            }
            else {
              local_88 = (ulong)connection->endpoint_count - (ulong)l_1._4_4_;
            }
            auVar2._8_8_ = 0;
            auVar2._0_8_ = local_88;
            if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar2,0) < 8) {
              local_98 = 0xffffffffffffffff;
            }
            else {
              if (connection->endpoint_count < l_1._4_4_) {
                local_90 = -1;
              }
              else {
                local_90 = (ulong)connection->endpoint_count - (ulong)l_1._4_4_;
              }
              local_98 = local_90 << 3;
            }
            local_80 = local_98;
          }
          if (local_80 == 0xffffffffffffffff) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                        ,"connection_create_endpoint",0x784,1,"Cannot memmove endpoints, size:%zu",
                        0xffffffffffffffff);
            }
          }
          else {
            memmove(connection->endpoints + (l_1._4_4_ + 1),connection->endpoints + l_1._4_4_,
                    local_80);
          }
        }
        connection->endpoints[l_1._4_4_] = (ENDPOINT_INSTANCE *)l;
        connection->endpoint_count = connection->endpoint_count + 1;
      }
    }
  }
  else {
    l = (LOGGER_LOG)0x0;
  }
  return (ENDPOINT_HANDLE)l;
}

Assistant:

ENDPOINT_HANDLE connection_create_endpoint(CONNECTION_HANDLE connection)
{
    ENDPOINT_HANDLE result;

    /* Codes_S_R_S_CONNECTION_01_113: [If connection, on_endpoint_frame_received or on_connection_state_changed is NULL, connection_create_endpoint shall fail and return NULL.] */
    /* Codes_S_R_S_CONNECTION_01_193: [The context argument shall be allowed to be NULL.] */
    if (connection == NULL)
    {
        LogError("NULL connection");
        result = NULL;
    }
    else
    {
        /* Codes_S_R_S_CONNECTION_01_115: [If no more endpoints can be created due to all channels being used, connection_create_endpoint shall fail and return NULL.] */
        if (connection->endpoint_count >= connection->channel_max)
        {
            result = NULL;
        }
        else
        {
            uint32_t i = 0;

            /* Codes_S_R_S_CONNECTION_01_128: [The lowest number outgoing channel shall be associated with the newly created endpoint.] */
            for (i = 0; i < connection->endpoint_count; i++)
            {
                if (connection->endpoints[i]->outgoing_channel > i)
                {
                    /* found a gap in the sorted endpoint array */
                    break;
                }
            }

            /* Codes_S_R_S_CONNECTION_01_127: [On success, connection_create_endpoint shall return a non-NULL handle to the newly created endpoint.] */
            result = (ENDPOINT_HANDLE)calloc(1, sizeof(ENDPOINT_INSTANCE));
            /* Codes_S_R_S_CONNECTION_01_196: [If memory cannot be allocated for the new endpoint, connection_create_endpoint shall fail and return NULL.] */
            if (result == NULL)
            {
                LogError("Cannot allocate memory for endpoint");
            }
            else
            {
                ENDPOINT_HANDLE* new_endpoints;

                result->on_endpoint_frame_received = NULL;
                result->on_connection_state_changed = NULL;
                result->callback_context = NULL;
                result->outgoing_channel = (uint16_t)i;
                result->connection = connection;

                /* Codes_S_R_S_CONNECTION_01_197: [The newly created endpoint shall be added to the endpoints list, so that it can be tracked.] */
                size_t realloc_size = safe_add_size_t((size_t)connection->endpoint_count, 1);
                realloc_size = safe_multiply_size_t(realloc_size, sizeof(ENDPOINT_HANDLE));
                if (realloc_size == SIZE_MAX ||
                    (new_endpoints = (ENDPOINT_HANDLE*)realloc(connection->endpoints, realloc_size)) == NULL)
                {
                    /* Tests_S_R_S_CONNECTION_01_198: [If adding the endpoint to the endpoints list tracked by the connection fails, connection_create_endpoint shall fail and return NULL.] */
                    LogError("Cannot reallocate memory for connection endpoints, size:%zu", realloc_size);
                    free(result);
                    result = NULL;
                }
                else
                {
                    connection->endpoints = new_endpoints;

                    if (i < connection->endpoint_count)
                    {
                        size_t memmove_size = safe_multiply_size_t(safe_subtract_size_t(connection->endpoint_count, i), sizeof(ENDPOINT_INSTANCE*));
                        if (memmove_size != SIZE_MAX)
                        {
                            (void)memmove(&connection->endpoints[i + 1], &connection->endpoints[i], memmove_size);
                        }
                        else
                        {
                            LogError("Cannot memmove endpoints, size:%zu", memmove_size);
                        }
                    }

                    connection->endpoints[i] = result;
                    connection->endpoint_count++;

                    /* Codes_S_R_S_CONNECTION_01_112: [connection_create_endpoint shall create a new endpoint that can be used by a session.] */
                }
            }
        }
    }

    return result;
}